

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_sectors.cpp
# Opt level: O1

int __thiscall sector_t::FindMinSurroundingLight(sector_t *this,int min)

{
  line_t_conflict *plVar1;
  long lVar2;
  sector_t_conflict *psVar3;
  
  if (0 < (long)this->linecount) {
    lVar2 = 0;
    do {
      plVar1 = this->lines[lVar2];
      if ((plVar1->flags & 4) == 0) {
        psVar3 = (sector_t_conflict *)0x0;
      }
      else {
        psVar3 = plVar1->frontsector;
        if (plVar1->frontsector == (sector_t_conflict *)this) {
          psVar3 = (sector_t_conflict *)0x0;
          if (plVar1->backsector != (sector_t_conflict *)this) {
            psVar3 = plVar1->backsector;
          }
        }
      }
      if ((psVar3 != (sector_t_conflict *)0x0) && (psVar3->lightlevel <= min)) {
        min = (int)psVar3->lightlevel;
      }
      lVar2 = lVar2 + 1;
    } while (this->linecount != lVar2);
  }
  return min;
}

Assistant:

int sector_t::FindMinSurroundingLight (int min) const
{
	int 		i;
	line_t* 	line;
	sector_t*	check;
		
	for (i = 0; i < linecount; i++)
	{
		line = lines[i];
		if (NULL != (check = getNextSector (line, this)) &&
			check->lightlevel < min)
		{
			min = check->lightlevel;
		}
	}
	return min;
}